

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# train_sudoku.cpp
# Opt level: O3

void __thiscall
TrainSudoku::addTrainDependencies
          (TrainSudoku *this,
          set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          *a,set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
             *b)

{
  _Rb_tree_header *p_Var1;
  Field *pFVar2;
  int iVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  _Rb_tree_header *p_Var6;
  set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_> aFields;
  set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_> bFields;
  _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
  local_f0;
  _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
  local_c0;
  _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
  local_90;
  _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
  local_60;
  
  p_Var1 = &local_f0._M_impl.super__Rb_tree_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var4 = (a->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(a->_M_t)._M_impl.super__Rb_tree_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var6) {
    do {
      iVar3 = (*(this->super_Sudoku)._vptr_Sudoku[7])
                        (this,(ulong)p_Var4[1]._M_color,(ulong)*(uint *)&p_Var4[1].field_0x4);
      std::
      _Rb_tree<std::shared_ptr<Field>,std::shared_ptr<Field>,std::_Identity<std::shared_ptr<Field>>,CompareFields,std::allocator<std::shared_ptr<Field>>>
      ::_M_insert_unique<std::shared_ptr<Field>const&>
                ((_Rb_tree<std::shared_ptr<Field>,std::shared_ptr<Field>,std::_Identity<std::shared_ptr<Field>>,CompareFields,std::allocator<std::shared_ptr<Field>>>
                  *)&local_f0,
                 (this->super_Sudoku).fields_.
                 super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar3);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var6);
  }
  p_Var6 = &local_c0._M_impl.super__Rb_tree_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var4 = (b->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(b->_M_t)._M_impl.super__Rb_tree_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    do {
      iVar3 = (*(this->super_Sudoku)._vptr_Sudoku[7])
                        (this,(ulong)p_Var4[1]._M_color,(ulong)*(uint *)&p_Var4[1].field_0x4);
      std::
      _Rb_tree<std::shared_ptr<Field>,std::shared_ptr<Field>,std::_Identity<std::shared_ptr<Field>>,CompareFields,std::allocator<std::shared_ptr<Field>>>
      ::_M_insert_unique<std::shared_ptr<Field>const&>
                ((_Rb_tree<std::shared_ptr<Field>,std::shared_ptr<Field>,std::_Identity<std::shared_ptr<Field>>,CompareFields,std::allocator<std::shared_ptr<Field>>>
                  *)&local_c0,
                 (this->super_Sudoku).fields_.
                 super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar3);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  if ((_Rb_tree_header *)local_f0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var4 = local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pFVar2 = *(Field **)(p_Var4 + 1);
      std::
      _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
      ::_Rb_tree(&local_60,&local_c0);
      Field::addGroupDependency
                (pFVar2,(set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                         *)&local_60);
      std::
      _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
      ::~_Rb_tree(&local_60);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  if ((_Rb_tree_header *)local_c0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var6) {
    p_Var4 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pFVar2 = *(Field **)(p_Var4 + 1);
      std::
      _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
      ::_Rb_tree(&local_90,&local_f0);
      Field::addGroupDependency
                (pFVar2,(set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                         *)&local_90);
      std::
      _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
      ::~_Rb_tree(&local_90);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var6);
  }
  std::
  _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
  ::~_Rb_tree(&local_f0);
  return;
}

Assistant:

void TrainSudoku::addTrainDependencies(
  const std::set<std::pair<int, int>>& a,
  const std::set<std::pair<int, int>>& b)
{
  // Convert coordinate pairs to shared_ptr<Field> for the fields.
  auto toFieldSet = [this](const std::set<std::pair<int, int>>& coords) {
      std::set<std::shared_ptr<Field>, CompareFields> fieldSet;
      for (const auto& coord : coords) {
          fieldSet.insert(fields_[index(coord.first, coord.second)]);
      }
      return fieldSet;
  };

  // Create the field sets for a and b
  auto aFields = toFieldSet(a);
  auto bFields = toFieldSet(b);

  // Add dependencies from a to b
  for (const auto& fieldA : aFields) {
      fieldA->addGroupDependency(bFields);
  }

  // Add dependencies from b to a
  for (const auto& fieldB : bFields) {
      fieldB->addGroupDependency(aFields);
  }
}